

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cSeparateShaderObjsTests.cpp
# Opt level: O0

void __thiscall
glcts::InterfaceMatchingCaseFloat::generateVarLinkVertexShaderSrc
          (InterfaceMatchingCaseFloat *this,string *outVtxSrc,GLSLVersion glslVersion,
          string *precision,TestType testMode)

{
  char *pcVar1;
  ostream *poVar2;
  string local_1d8 [48];
  undefined1 local_1a8 [8];
  ostringstream vtxSrc;
  TestType testMode_local;
  string *precision_local;
  GLSLVersion glslVersion_local;
  string *outVtxSrc_local;
  InterfaceMatchingCaseFloat *this_local;
  
  vtxSrc._372_4_ = testMode;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  pcVar1 = glu::getGLSLVersionDeclaration(glslVersion);
  poVar2 = std::operator<<((ostream *)local_1a8,pcVar1);
  std::operator<<(poVar2,"\n");
  if (8 < (int)glslVersion) {
    std::operator<<((ostream *)local_1a8,"out gl_PerVertex {\n  vec4 gl_Position;\n};\n");
  }
  std::operator<<((ostream *)local_1a8,"in highp vec4 a_position;\n");
  std::operator<<((ostream *)local_1a8,"uniform highp vec4 u_color;\n");
  if (vtxSrc._372_4_ != 0) {
    if (vtxSrc._372_4_ != 1) {
      if (vtxSrc._372_4_ == 2) {
        poVar2 = std::operator<<((ostream *)local_1a8,"out ");
        poVar2 = std::operator<<(poVar2,(string *)precision);
        std::operator<<(poVar2," float var;\n");
      }
      goto LAB_013e22e1;
    }
    poVar2 = std::operator<<((ostream *)local_1a8,"precision ");
    poVar2 = std::operator<<(poVar2,(string *)precision);
    std::operator<<(poVar2," float;\n");
  }
  std::operator<<((ostream *)local_1a8,"out float var;\n");
LAB_013e22e1:
  std::operator<<((ostream *)local_1a8,"void main (void)\n");
  std::operator<<((ostream *)local_1a8,"{\n");
  std::operator<<((ostream *)local_1a8,"   gl_Position = a_position;\n");
  std::operator<<((ostream *)local_1a8,"   var = u_color.r;\n");
  std::operator<<((ostream *)local_1a8,"}\n");
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::operator=((string *)outVtxSrc,local_1d8);
  std::__cxx11::string::~string(local_1d8);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return;
}

Assistant:

void generateVarLinkVertexShaderSrc(std::string& outVtxSrc, glu::GLSLVersion glslVersion, const string& precision,
										TestType testMode)
	{
		std::ostringstream vtxSrc;
		vtxSrc << glu::getGLSLVersionDeclaration(glslVersion) << "\n";
		if (glslVersion >= glu::GLSL_VERSION_410)
		{
			vtxSrc << "out gl_PerVertex {\n"
					  "  vec4 gl_Position;\n"
					  "};\n";
		}
		vtxSrc << "in highp vec4 a_position;\n";
		vtxSrc << "uniform highp vec4 u_color;\n";
		switch (testMode)
		{
		case SET_DEFAULT_PRECISION:
			vtxSrc << "precision " << precision << " float;\n";
		case DEFAULT_PRECISION:
			vtxSrc << "out float var;\n";
			break;
		case SET_PRECISION:
			vtxSrc << "out " << precision << " float var;\n";
			break;
		}
		vtxSrc << "void main (void)\n";
		vtxSrc << "{\n";
		vtxSrc << "   gl_Position = a_position;\n";
		vtxSrc << "   var = u_color.r;\n";
		vtxSrc << "}\n";
		outVtxSrc = vtxSrc.str();
	}